

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void expr(Vm *vm)

{
  Vm *vm_local;
  
  switch((vm->compiler).token.type) {
  case TOKEN_IDENTIFIER:
    assignment(vm);
    break;
  default:
    logic_or(vm);
    break;
  case TOKEN_OPEN_BRACE:
    block_expr(vm);
    break;
  case TOKEN_IF:
    if_expr(vm);
    break;
  case TOKEN_FUN:
    lambda(vm);
  }
  return;
}

Assistant:

static void expr(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_FUN:
            lambda(vm);
            break;
        case TOKEN_OPEN_BRACE:
            block_expr(vm);
            break;
        case TOKEN_IF:
            if_expr(vm);
            break;
        case TOKEN_IDENTIFIER:
            assignment(vm);
            break;
        default:
            logic_or(vm);
            break;
    }
}